

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

void singlevar(LexState *ls,expdesc *var)

{
  FuncState *fs;
  TString *n;
  expdesc key;
  expdesc local_38;
  
  n = str_checkname(ls);
  fs = ls->fs;
  singlevaraux(fs,n,var,1);
  if (var->k == VVOID) {
    singlevaraux(fs,ls->envn,var,1);
    local_38.u.info = luaK_stringK(ls->fs,n);
    local_38.t = -1;
    local_38.f = -1;
    local_38.k = VK;
    luaK_indexed(fs,var,&local_38);
  }
  return;
}

Assistant:

static void singlevar(LexState *ls, expdesc *var) {
    TString *varname = str_checkname(ls);
    FuncState *fs = ls->fs;
    singlevaraux(fs, varname, var, 1);
    if (var->k == VVOID) {  /* global name? */
        expdesc key;
        singlevaraux(fs, ls->envn, var, 1);  /* get environment variable */
        lua_assert(var->k != VVOID);  /* this one must exist */
        codestring(ls, &key, varname);  /* key is variable name */
        luaK_indexed(fs, var, &key);  /* env[varname] */
    }
}